

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::VariableP<tcu::Matrix<float,_2,_3>_>::VariableP
          (VariableP<tcu::Matrix<float,_2,_3>_> *this,Variable<tcu::Matrix<float,_2,_3>_> *ptr)

{
  Variable<tcu::Matrix<float,_2,_3>_> *ptr_local;
  VariableP<tcu::Matrix<float,_2,_3>_> *this_local;
  
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>::SharedPtr
            (&this->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
             ,ptr);
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}